

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

SquareMatrix<3> * pbrt::SquareMatrix<3>::Zero(void)

{
  SquareMatrix<3> *in_RDI;
  int j;
  int i;
  int local_8;
  int local_4;
  
  SquareMatrix(in_RDI);
  for (local_4 = 0; local_4 < 3; local_4 = local_4 + 1) {
    for (local_8 = 0; local_8 < 3; local_8 = local_8 + 1) {
      in_RDI->m[local_4][local_8] = 0.0;
    }
  }
  return in_RDI;
}

Assistant:

Zero() {
        SquareMatrix m;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                m.m[i][j] = 0;
        return m;
    }